

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

void ccall_classify_ct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  CTSize CVar1;
  uint uVar2;
  uint local_80;
  int cl;
  CTSize asz;
  CTSize esz;
  CTSize eofs;
  CType *cct;
  CTSize ofs_local;
  int *rcl_local;
  CType *ct_local;
  CTState *cts_local;
  
  cts_local = (CTState *)ct;
  if (ct->info >> 0x1c == 3) {
    do {
      cts_local = (CTState *)(cts->tab + (*(uint *)&cts_local->tab & 0xffff));
    } while (*(uint *)&cts_local->tab >> 0x1c == 8);
    CVar1 = *(CTSize *)((long)&cts_local->tab + 4);
    uVar2 = ct->size;
    for (asz = 0; asz < uVar2; asz = CVar1 + asz) {
      ccall_classify_ct(cts,(CType *)cts_local,rcl,ofs + asz);
    }
  }
  else if (ct->info >> 0x1c == 1) {
    ccall_classify_struct(cts,ct,rcl,ofs);
  }
  else {
    local_80 = 1;
    if ((ct->info & 0xf4000000) == 0x4000000) {
      local_80 = 2;
    }
    if ((ofs & ct->size - 1) != 0) {
      local_80 = 4;
    }
    rcl[(int)(uint)(7 < ofs)] = local_80 | rcl[(int)(uint)(7 < ofs)];
  }
  return;
}

Assistant:

static void ccall_classify_ct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ctype_isarray(ct->info)) {
    CType *cct = ctype_rawchild(cts, ct);
    CTSize eofs, esz = cct->size, asz = ct->size;
    for (eofs = 0; eofs < asz; eofs += esz)
      ccall_classify_ct(cts, cct, rcl, ofs+eofs);
  } else if (ctype_isstruct(ct->info)) {
    ccall_classify_struct(cts, ct, rcl, ofs);
  } else {
    int cl = ctype_isfp(ct->info) ? CCALL_RCL_SSE : CCALL_RCL_INT;
    lj_assertCTS(ctype_hassize(ct->info),
		 "classify ctype %08x without size", ct->info);
    if ((ofs & (ct->size-1))) cl = CCALL_RCL_MEM;  /* Unaligned. */
    rcl[(ofs >= 8)] |= cl;
  }
}